

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listing.cpp
# Opt level: O0

void listing_load_inputfile(char *src_filename)

{
  byte bVar1;
  failure *e;
  string line;
  istream local_218 [8];
  ifstream src;
  char *src_filename_local;
  
  std::ifstream::ifstream(local_218,src_filename,8);
  while( true ) {
    bVar1 = std::ios::eof();
    if (((bVar1 ^ 0xff) & 1) == 0) break;
    std::__cxx11::string::string((string *)&e);
    std::getline<char,std::char_traits<char>,std::allocator<char>>(local_218,(string *)&e);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&srcfile_abi_cxx11_,(value_type *)&e);
    std::__cxx11::string::~string((string *)&e);
  }
  std::ifstream::close();
  std::ifstream::~ifstream(local_218);
  return;
}

Assistant:

void listing_load_inputfile(const char *src_filename)
{
	try {
		std::ifstream src (src_filename);
		while ( ! src.eof()) {
			std::string line;
			getline(src, line);
			srcfile.push_back(line);
		}
		src.close();
	} catch (std::ios_base::failure& e) {
		std::cerr << "IO exception: " << e.what() << endl;
	}
}